

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

int ON_SubDEdgePtrLink::CompareVertex(ON_SubDEdgePtrLink *lhs,ON_SubDEdgePtrLink *rhs)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (lhs->m_ep).m_ptr;
  uVar3 = uVar2 & 0xfffffffffffffff8;
  if (uVar3 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ulong *)(uVar3 + 0x80 + (ulong)((uint)uVar2 & 1) * 8);
  }
  uVar3 = (rhs->m_ep).m_ptr;
  uVar4 = uVar3 & 0xfffffffffffffff8;
  if (uVar4 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ulong *)(uVar4 + 0x80 + (ulong)((uint)uVar3 & 1) * 8);
  }
  uVar1 = 0xffffffff;
  if (uVar3 <= uVar2) {
    uVar1 = (uint)(uVar3 < uVar2);
  }
  return uVar1;
}

Assistant:

const class ON_SubDVertex* ON_SubDEdgePtr::RelativeVertex(
  int relative_vertex_index
  ) const
{
  for (;;)
  {
    if (relative_vertex_index < 0 || relative_vertex_index>1)
      break;
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_ptr);
    if (nullptr == edge)
      break;
    if (0 != ON_SUBD_EDGE_DIRECTION(m_ptr))
      relative_vertex_index = 1 - relative_vertex_index;
    return edge->m_vertex[relative_vertex_index];
  }
  return nullptr;
}